

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void estimate<std::_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
               (Graph *g,string_view name,
               _Bind<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
               *f,bool show)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  LightEdge *e;
  vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> bridges;
  _Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> local_50;
  Graph *local_38;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  local_38 = g;
  std::
  _Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>
  ::operator()((vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> *)&local_50,
               (_Bind<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>
                *)f,&local_38);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,name._M_str,name._M_len);
  poVar3 = std::operator<<(poVar3," search found ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," bridges and worked for ");
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  poVar3 = std::operator<<(poVar3," sec.");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (show) {
    for (; local_50._M_impl.super__Vector_impl_data._M_start !=
           local_50._M_impl.super__Vector_impl_data._M_finish;
        local_50._M_impl.super__Vector_impl_data._M_start =
             local_50._M_impl.super__Vector_impl_data._M_start + 1) {
      poVar3 = operator<<((ostream *)&std::cout,local_50._M_impl.super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::_Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void estimate(Graph &g, std::string_view name, Functor f, bool show) {
    auto start = std::chrono::system_clock::now();
    auto bridges = f(&g);
    auto end = std::chrono::system_clock::now();

    std::cout << name << " search found " << bridges.size()
              << " bridges and worked for "
              << std::chrono::duration<double>(end - start).count() << " sec."
              << std::endl;

    if (show)
        for (auto &e : bridges)
            std::cout << e << std::endl;
}